

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,ExpressionSyntax *args_3,Token *args_4,
          SyntaxList<slang::syntax::CaseItemSyntax> *args_5,Token *args_6)

{
  Token keyword;
  Token openParen;
  Token closeParen;
  Token endCase;
  CaseGenerateSyntax *this_00;
  
  this_00 = (CaseGenerateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseGenerateSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CaseGenerateSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  endCase.kind = args_6->kind;
  endCase._2_1_ = args_6->field_0x2;
  endCase.numFlags.raw = (args_6->numFlags).raw;
  endCase.rawLen = args_6->rawLen;
  endCase.info = args_6->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::CaseGenerateSyntax::CaseGenerateSyntax
            (this_00,args,keyword,openParen,args_3,closeParen,args_5,endCase);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }